

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyT<char>::clear(PropertyT<char> *this)

{
  _Vector_base<char,_std::allocator<char>_> local_20;
  
  local_20._M_impl.super__Vector_impl_data._M_start =
       (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_20._M_impl.super__Vector_impl_data._M_finish =
       (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (local_20._M_impl.super__Vector_impl_data._M_finish !=
      local_20._M_impl.super__Vector_impl_data._M_start) {
    (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_20._M_impl.super__Vector_impl_data._M_start;
    local_20._M_impl.super__Vector_impl_data._M_finish =
         local_20._M_impl.super__Vector_impl_data._M_start;
  }
  local_20._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_20);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }